

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int ObsCurPlayerOffset(pyhanabi_observation_t *observation)

{
  int iVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x295,"int ObsCurPlayerOffset(pyhanabi_observation_t *)");
  }
  if (*in_RDI != 0) {
    iVar1 = hanabi_learning_env::HanabiObservation::CurPlayerOffset((HanabiObservation *)*in_RDI);
    return iVar1;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x296,"int ObsCurPlayerOffset(pyhanabi_observation_t *)");
}

Assistant:

int ObsCurPlayerOffset(pyhanabi_observation_t* observation) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  return reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
             observation->observation)
      ->CurPlayerOffset();
}